

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

int __thiscall soplex::SPxDantzigPR<double>::selectLeaveSparse(SPxDantzigPR<double> *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  lVar8 = (long)(pSVar4->infeasibilities).super_IdxSet.num;
  if (0 < lVar8) {
    dVar9 = -(this->super_SPxPricer<double>).thetolerance;
    pdVar5 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pSVar4->infeasibilities).super_IdxSet.idx;
    lVar8 = lVar8 + 1;
    iVar7 = -1;
    dVar10 = dVar9;
    do {
      iVar2 = piVar6[lVar8 + -2];
      dVar1 = pdVar5[iVar2];
      if (dVar9 <= dVar1) {
        iVar3 = (pSVar4->infeasibilities).super_IdxSet.num;
        (pSVar4->infeasibilities).super_IdxSet.num = iVar3 + -1;
        piVar6[lVar8 + -2] = piVar6[(long)iVar3 + -1];
        (pSVar4->isInfeasible).data[iVar2] = 0;
      }
      else if (dVar1 < dVar10) {
        dVar10 = dVar1;
        iVar7 = iVar2;
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
    return iVar7;
  }
  return -1;
}

Assistant:

int SPxDantzigPR<R>::selectLeaveSparse()
{
   assert(this->thesolver != nullptr);

   R best   = -this->thetolerance;
   R x;
   int  n      = -1;
   int  index;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      index = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->fTest()[index];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = index;
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[index] > 0);
         this->thesolver->isInfeasible[index] = 0;
      }
   }

   return n;
}